

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int ARGBLumaColorTable(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,
                      uint8_t *luma,int width,int height)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  code *pcVar4;
  bool bVar5;
  int local_44;
  
  if (height == 0 ||
      ((width < 1 || luma == (uint8_t *)0x0) ||
      (dst_argb == (uint8_t *)0x0 || src_argb == (uint8_t *)0x0))) {
    iVar1 = -1;
  }
  else {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_argb = src_argb + ~height * src_stride_argb;
      src_stride_argb = -src_stride_argb;
    }
    local_44 = src_stride_argb;
    if (width * 4 == dst_stride_argb && src_stride_argb == width * 4) {
      width = iVar1 * width;
      iVar1 = 1;
      local_44 = 0;
      dst_stride_argb = 0;
    }
    iVar2 = libyuv::TestCpuFlag(0x40);
    pcVar3 = ARGBLumaColorTableRow_C;
    if ((width & 3U) == 0) {
      pcVar3 = ARGBLumaColorTableRow_SSSE3;
    }
    pcVar4 = ARGBLumaColorTableRow_C;
    if (iVar2 != 0) {
      pcVar4 = pcVar3;
    }
    while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
      (*pcVar4)(src_argb,dst_argb,width,luma,0x264b0f);
      src_argb = src_argb + local_44;
      dst_argb = dst_argb + dst_stride_argb;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBLumaColorTable(const uint8_t* src_argb,
                       int src_stride_argb,
                       uint8_t* dst_argb,
                       int dst_stride_argb,
                       const uint8_t* luma,
                       int width,
                       int height) {
  int y;
  void (*ARGBLumaColorTableRow)(
      const uint8_t* src_argb, uint8_t* dst_argb, int width,
      const uint8_t* luma, const uint32_t lumacoeff) = ARGBLumaColorTableRow_C;
  if (!src_argb || !dst_argb || !luma || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb == width * 4 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBLUMACOLORTABLEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && IS_ALIGNED(width, 4)) {
    ARGBLumaColorTableRow = ARGBLumaColorTableRow_SSSE3;
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBLumaColorTableRow(src_argb, dst_argb, width, luma, 0x00264b0f);
    src_argb += src_stride_argb;
    dst_argb += dst_stride_argb;
  }
  return 0;
}